

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_lock.c
# Opt level: O2

ALLEGRO_LOCKED_REGION *
al_lock_bitmap_region(ALLEGRO_BITMAP *bitmap,int x,int y,int width,int height,int format,int flags)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int format_00;
  int iVar6;
  ALLEGRO_LOCKED_REGION *pAVar7;
  ALLEGRO_DISPLAY *display;
  void *pvVar8;
  int iVar9;
  int iVar10;
  int sy;
  int sx;
  
  iVar2 = al_get_bitmap_format(bitmap);
  uVar3 = al_get_bitmap_flags(bitmap);
  iVar4 = al_get_pixel_block_width(iVar2);
  iVar5 = al_get_pixel_block_height(iVar2);
  _al_pixel_format_is_real(format);
  if (bitmap->parent != (ALLEGRO_BITMAP *)0x0) {
    x = x + bitmap->xofs;
    y = y + bitmap->yofs;
    bitmap = bitmap->parent;
  }
  if (bitmap->locked == false) {
    if (((uVar3 | flags) & 1) == 0) {
      bitmap->dirty = true;
    }
    iVar9 = x % iVar4;
    sx = x - iVar9;
    iVar10 = y % iVar5;
    sy = y - iVar10;
    iVar4 = _al_get_least_multiple(x + width,iVar4);
    iVar4 = iVar4 - sx;
    iVar5 = _al_get_least_multiple(y + height,iVar5);
    iVar5 = iVar5 - sy;
    bitmap->lock_x = sx;
    bitmap->lock_y = sy;
    bitmap->lock_w = iVar4;
    bitmap->lock_h = iVar5;
    bitmap->lock_flags = flags;
    if (flags == 2) {
      flags = (uint)(height == iVar5 && (width == iVar4 && (iVar9 == 0 && iVar10 == 0))) * 2;
    }
    if ((uVar3 & 1) == 0) {
      pAVar7 = (*bitmap->vt->lock_region)(bitmap,sx,sy,iVar4,iVar5,format,flags);
      if (pAVar7 != (ALLEGRO_LOCKED_REGION *)0x0) {
LAB_00142df8:
        pvVar8 = pAVar7->data;
        bitmap->lock_data = pvVar8;
        pAVar7->data = (void *)((long)pvVar8 +
                               (long)iVar10 * (long)pAVar7->pitch +
                               (long)iVar9 * (long)pAVar7->pixel_size);
        bitmap->locked = true;
        return pAVar7;
      }
    }
    else {
      display = al_get_current_display();
      format_00 = _al_get_real_pixel_format(display,format);
      if (-1 < format_00) {
        if (((format == 0) || (iVar2 == format)) || (iVar2 == format_00)) {
          iVar4 = bitmap->pitch;
          puVar1 = bitmap->memory;
          iVar5 = al_get_pixel_size(iVar2);
          (bitmap->locked_region).data = puVar1 + (long)(iVar5 * sx) + (long)sy * (long)iVar4;
          (bitmap->locked_region).format = iVar2;
          (bitmap->locked_region).pitch = bitmap->pitch;
          iVar2 = al_get_pixel_size(iVar2);
          (bitmap->locked_region).pixel_size = iVar2;
        }
        else {
          iVar6 = al_get_pixel_size(format_00);
          (bitmap->locked_region).pitch = iVar6 * iVar4;
          pvVar8 = al_malloc_with_context
                             ((long)(iVar6 * iVar4 * iVar5),0x5f,
                              "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap_lock.c"
                              ,"al_lock_bitmap_region");
          (bitmap->locked_region).data = pvVar8;
          (bitmap->locked_region).format = format_00;
          iVar6 = al_get_pixel_size(format_00);
          (bitmap->locked_region).pixel_size = iVar6;
          if ((bitmap->lock_flags & 2) == 0) {
            _al_convert_bitmap_data
                      (bitmap->memory,iVar2,bitmap->pitch,(bitmap->locked_region).data,format_00,
                       (bitmap->locked_region).pitch,sx,sy,0,0,iVar4,iVar5);
          }
        }
        pAVar7 = &bitmap->locked_region;
        goto LAB_00142df8;
      }
    }
  }
  return (ALLEGRO_LOCKED_REGION *)0x0;
}

Assistant:

ALLEGRO_LOCKED_REGION *al_lock_bitmap_region(ALLEGRO_BITMAP *bitmap,
   int x, int y, int width, int height, int format, int flags)
{
   ALLEGRO_LOCKED_REGION *lr;
   int bitmap_format = al_get_bitmap_format(bitmap);
   int bitmap_flags = al_get_bitmap_flags(bitmap);
   int block_width = al_get_pixel_block_width(bitmap_format);
   int block_height = al_get_pixel_block_height(bitmap_format);
   int xc, yc, wc, hc;
   ASSERT(x >= 0);
   ASSERT(y >= 0);
   ASSERT(width >= 0);
   ASSERT(height >= 0);
   ASSERT(!_al_pixel_format_is_video_only(format));
   if (_al_pixel_format_is_real(format)) {
      ASSERT(al_get_pixel_block_width(format) == 1);
      ASSERT(al_get_pixel_block_height(format) == 1);
   }

   /* For sub-bitmaps */
   if (bitmap->parent) {
      x += bitmap->xofs;
      y += bitmap->yofs;
      bitmap = bitmap->parent;
   }

   if (bitmap->locked)
      return NULL;

   if (!(bitmap_flags & ALLEGRO_MEMORY_BITMAP) &&
         !(flags & ALLEGRO_LOCK_READONLY))
      bitmap->dirty = true;

   ASSERT(x+width <= bitmap->w);
   ASSERT(y+height <= bitmap->h);

   xc = (x / block_width) * block_width;
   yc = (y / block_height) * block_height;
   wc = _al_get_least_multiple(x + width, block_width) - xc;
   hc = _al_get_least_multiple(y + height, block_height) - yc;

   bitmap->lock_x = xc;
   bitmap->lock_y = yc;
   bitmap->lock_w = wc;
   bitmap->lock_h = hc;
   bitmap->lock_flags = flags;

   if (flags == ALLEGRO_LOCK_WRITEONLY &&
       (xc != x || yc != y || wc != width || hc != height)) {
      /* Unaligned write-only access requires that we fill in the padding
       * from the texture.
       * XXX: In principle, this could be done more efficiently. */
      flags = ALLEGRO_LOCK_READWRITE;
   }

   if (bitmap_flags & ALLEGRO_MEMORY_BITMAP) {
      int f = _al_get_real_pixel_format(al_get_current_display(), format);
      if (f < 0) {
         return NULL;
      }
      ASSERT(bitmap->memory);
      if (format == ALLEGRO_PIXEL_FORMAT_ANY || bitmap_format == format || bitmap_format == f) {
         bitmap->locked_region.data = bitmap->memory
            + bitmap->pitch * yc + xc * al_get_pixel_size(bitmap_format);
         bitmap->locked_region.format = bitmap_format;
         bitmap->locked_region.pitch = bitmap->pitch;
         bitmap->locked_region.pixel_size = al_get_pixel_size(bitmap_format);
      }
      else {
         bitmap->locked_region.pitch = al_get_pixel_size(f) * wc;
         bitmap->locked_region.data = al_malloc(bitmap->locked_region.pitch*hc);
         bitmap->locked_region.format = f;
         bitmap->locked_region.pixel_size = al_get_pixel_size(f);
         if (!(bitmap->lock_flags & ALLEGRO_LOCK_WRITEONLY)) {
            _al_convert_bitmap_data(
               bitmap->memory, bitmap_format, bitmap->pitch,
               bitmap->locked_region.data, f, bitmap->locked_region.pitch,
               xc, yc, 0, 0, wc, hc);
         }
      }
      lr = &bitmap->locked_region;
   }
   else {
      lr = bitmap->vt->lock_region(bitmap, xc, yc, wc, hc, format, flags);
      if (!lr) {
         return NULL;
      }
   }

   bitmap->lock_data = lr->data;
   /* Fixup the data pointer for unaligned access */
   lr->data = (char*)lr->data + (x - xc) * lr->pixel_size + (y - yc) * lr->pitch;

   bitmap->locked = true;

   return lr;
}